

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

binarydata * __thiscall
NetworkDataType::
serializedata<std::vector<NDevice,std::allocator<NDevice>>const,std::vector<NTrodeObj,std::allocator<NTrodeObj>>const>
          (binarydata *__return_storage_ptr__,NetworkDataType *this,
          vector<NDevice,_std::allocator<NDevice>_> *args,
          vector<NTrodeObj,_std::allocator<NTrodeObj>_> *args_1)

{
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string local_2c8;
  PortableBinaryOutputArchive local_2a8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_2c8._M_dataplus._M_p._0_1_ =
       cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (&local_2a8,(ostream *)local_198,(Options *)&local_2c8);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::
  process<std::vector<NDevice,std::allocator<NDevice>>const&,std::vector<NTrodeObj,std::allocator<NTrodeObj>>const&>
            ((OutputArchive<cereal::PortableBinaryOutputArchive,1u> *)
             local_2a8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self,
             (vector<NDevice,_std::allocator<NDevice>_> *)this,
             (vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)args);
  std::__cxx11::stringbuf::str();
  binarydata::binarydata(__return_storage_ptr__,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,_1U>::~OutputArchive
            (&local_2a8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }